

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeSorterAddToTree(SortSubtask *pTask,int nDepth,int iSeq,MergeEngine *pRoot,MergeEngine *pLeaf
                       )

{
  long lVar1;
  MergeEngine *pMerger;
  MergeEngine *pNew;
  PmaReader *pReadr;
  IncrMerger *pIStack_48;
  int iIter;
  IncrMerger *pIncr;
  MergeEngine *p;
  int local_30;
  int i;
  int nDiv;
  int rc;
  MergeEngine *pLeaf_local;
  MergeEngine *pRoot_local;
  int iSeq_local;
  int nDepth_local;
  SortSubtask *pTask_local;
  
  i = 0;
  local_30 = 1;
  pIncr = (IncrMerger *)pRoot;
  _nDiv = pLeaf;
  pLeaf_local = pRoot;
  pRoot_local._0_4_ = iSeq;
  pRoot_local._4_4_ = nDepth;
  _iSeq_local = pTask;
  i = vdbeIncrMergerNew(pTask,pLeaf,&stack0xffffffffffffffb8);
  for (p._4_4_ = 1; p._4_4_ < pRoot_local._4_4_; p._4_4_ = p._4_4_ + 1) {
    local_30 = local_30 << 4;
  }
  for (p._4_4_ = 1; p._4_4_ < pRoot_local._4_4_ && i == 0; p._4_4_ = p._4_4_ + 1) {
    lVar1 = *(long *)&pIncr->mxSz +
            (long)(int)((long)((ulong)(uint)((int)((long)(int)pRoot_local / (long)local_30) >> 0x1f)
                               << 0x20 | (long)(int)pRoot_local / (long)local_30 & 0xffffffffU) %
                       0x10) * 0x50;
    if (*(long *)(lVar1 + 0x48) == 0) {
      pMerger = vdbeMergeEngineNew(0x10);
      if (pMerger == (MergeEngine *)0x0) {
        i = 7;
      }
      else {
        i = vdbeIncrMergerNew(_iSeq_local,pMerger,(IncrMerger **)(lVar1 + 0x48));
      }
    }
    if (i == 0) {
      pIncr = *(IncrMerger **)(*(long *)(lVar1 + 0x48) + 8);
      local_30 = local_30 / 0x10;
    }
  }
  if (i == 0) {
    *(IncrMerger **)(*(long *)&pIncr->mxSz + (long)((int)pRoot_local % 0x10) * 0x50 + 0x48) =
         pIStack_48;
  }
  else {
    vdbeIncrFree(pIStack_48);
  }
  return i;
}

Assistant:

static int vdbeSorterAddToTree(
  SortSubtask *pTask,             /* Task context */
  int nDepth,                     /* Depth of tree according to TreeDepth() */
  int iSeq,                       /* Sequence number of leaf within tree */
  MergeEngine *pRoot,             /* Root of tree */
  MergeEngine *pLeaf              /* Leaf to add to tree */
){
  int rc = SQLITE_OK;
  int nDiv = 1;
  int i;
  MergeEngine *p = pRoot;
  IncrMerger *pIncr;

  rc = vdbeIncrMergerNew(pTask, pLeaf, &pIncr);

  for(i=1; i<nDepth; i++){
    nDiv = nDiv * SORTER_MAX_MERGE_COUNT;
  }

  for(i=1; i<nDepth && rc==SQLITE_OK; i++){
    int iIter = (iSeq / nDiv) % SORTER_MAX_MERGE_COUNT;
    PmaReader *pReadr = &p->aReadr[iIter];

    if( pReadr->pIncr==0 ){
      MergeEngine *pNew = vdbeMergeEngineNew(SORTER_MAX_MERGE_COUNT);
      if( pNew==0 ){
        rc = SQLITE_NOMEM_BKPT;
      }else{
        rc = vdbeIncrMergerNew(pTask, pNew, &pReadr->pIncr);
      }
    }
    if( rc==SQLITE_OK ){
      p = pReadr->pIncr->pMerger;
      nDiv = nDiv / SORTER_MAX_MERGE_COUNT;
    }
  }

  if( rc==SQLITE_OK ){
    p->aReadr[iSeq % SORTER_MAX_MERGE_COUNT].pIncr = pIncr;
  }else{
    vdbeIncrFree(pIncr);
  }
  return rc;
}